

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlPopPE(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlEntityPtr pxVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  xmlParserInputPtr pxVar6;
  unsigned_long uVar7;
  
  pxVar2 = ctxt->input->entity;
  uVar1 = pxVar2->flags;
  pxVar2->flags = uVar1 & 0xfffffff7;
  if ((uVar1 & 2) == 0) {
    do {
      ctxt->input->cur = ctxt->input->end;
      xmlParserShrink(ctxt);
      iVar3 = xmlParserGrow(ctxt);
    } while (0 < iVar3);
    pxVar6 = ctxt->input;
    uVar4 = (long)pxVar6->end - (long)pxVar6->base;
    uVar5 = uVar4 + pxVar6->consumed;
    if (CARRY8(uVar4,pxVar6->consumed)) {
      uVar5 = 0xffffffffffffffff;
    }
    uVar7 = pxVar2->expandedSize + uVar5;
    if (CARRY8(pxVar2->expandedSize,uVar5)) {
      uVar7 = 0xffffffffffffffff;
    }
    pxVar2->expandedSize = uVar7;
    if (pxVar2->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
      uVar7 = uVar5 + ctxt->sizeentities;
      if (CARRY8(uVar5,ctxt->sizeentities)) {
        uVar7 = 0xffffffffffffffff;
      }
      ctxt->sizeentities = uVar7;
    }
    *(byte *)&pxVar2->flags = (byte)pxVar2->flags | 2;
  }
  pxVar6 = xmlCtxtPopInput(ctxt);
  xmlFreeInputStream(pxVar6);
  xmlParserEntityCheck(ctxt,pxVar2->expandedSize);
  pxVar6 = ctxt->input;
  if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    return;
  }
  return;
}

Assistant:

static void
xmlPopPE(xmlParserCtxtPtr ctxt) {
    unsigned long consumed;
    xmlEntityPtr ent;

    ent = ctxt->input->entity;

    ent->flags &= ~XML_ENT_EXPANDING;

    if ((ent->flags & XML_ENT_CHECKED) == 0) {
        int result;

        /*
         * Read the rest of the stream in case of errors. We want
         * to account for the whole entity size.
         */
        do {
            ctxt->input->cur = ctxt->input->end;
            xmlParserShrink(ctxt);
            result = xmlParserGrow(ctxt);
        } while (result > 0);

        consumed = ctxt->input->consumed;
        xmlSaturatedAddSizeT(&consumed,
                             ctxt->input->end - ctxt->input->base);

        xmlSaturatedAdd(&ent->expandedSize, consumed);

        /*
         * Add to sizeentities when parsing an external entity
         * for the first time.
         */
        if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
            xmlSaturatedAdd(&ctxt->sizeentities, consumed);
        }

        ent->flags |= XML_ENT_CHECKED;
    }

    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    xmlParserEntityCheck(ctxt, ent->expandedSize);

    GROW;
}